

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_jsonreport.cpp
# Opt level: O0

int test_jsonreport_escape(ITesting *t)

{
  element_type *peVar1;
  element_type *this;
  ResultSummary *this_00;
  undefined1 local_150 [8];
  ResultsReportJSON jsonReport;
  shared_ptr<trun::TestResult> local_108;
  string local_f8;
  allocator<char> local_d1;
  string local_d0;
  allocator<char> local_a9;
  undefined1 local_a8 [8];
  string assertErrMsg;
  AssertError assertError;
  allocator<char> local_51;
  string local_50 [32];
  undefined1 local_30 [8];
  Ref result;
  shared_ptr<trun::TestFunc> tfunc;
  ITesting *t_local;
  
  std::make_shared<trun::TestFunc>();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_50,"dummy",&local_51);
  trun::TestResult::Create((string *)local_30);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator(&local_51);
  peVar1 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  trun::TestResult::SetResult(peVar1,kTestResult_TestFail);
  trun::AssertError::AssertError((AssertError *)((long)&assertErrMsg.field_2 + 8));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_a8,"fopen(\"filename.txt\",\"r\");",&local_a9);
  std::allocator<char>::~allocator(&local_a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d0,"dummy.cpp",&local_d1);
  std::__cxx11::string::string
            ((string *)&local_f8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_a8);
  trun::AssertError::Add
            ((AssertError *)((long)&assertErrMsg.field_2 + 8),kAssert_Error,0,&local_d0,&local_f8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator(&local_d1);
  peVar1 = std::__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<trun::TestResult,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  trun::TestResult::SetAssertError(peVar1,(AssertError *)((long)&assertErrMsg.field_2 + 8));
  this = std::__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator->((__shared_ptr_access<trun::TestFunc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                    )&result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount);
  std::shared_ptr<trun::TestResult>::shared_ptr(&local_108,(shared_ptr<trun::TestResult> *)local_30)
  ;
  trun::TestFunc::SetResultFromSubProcess(this,&local_108);
  std::shared_ptr<trun::TestResult>::~shared_ptr(&local_108);
  this_00 = trun::ResultSummary::Instance();
  std::shared_ptr<trun::TestFunc>::shared_ptr
            ((shared_ptr<trun::TestFunc> *)&jsonReport.bHadFailures,
             (shared_ptr<trun::TestFunc> *)
             &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  trun::ResultSummary::AddResult(this_00,(Ref *)&jsonReport.bHadFailures);
  std::shared_ptr<trun::TestFunc>::~shared_ptr
            ((shared_ptr<trun::TestFunc> *)&jsonReport.bHadFailures);
  trun::ResultsReportJSON::ResultsReportJSON((ResultsReportJSON *)local_150);
  trun::ResultsReportJSON::Begin((ResultsReportJSON *)local_150);
  trun::ResultsReportJSON::PrintReport((ResultsReportJSON *)local_150);
  trun::ResultsReportJSON::End((ResultsReportJSON *)local_150);
  trun::ResultsReportJSON::~ResultsReportJSON((ResultsReportJSON *)local_150);
  std::__cxx11::string::~string((string *)local_a8);
  trun::AssertError::~AssertError((AssertError *)((long)&assertErrMsg.field_2 + 8));
  std::shared_ptr<trun::TestResult>::~shared_ptr((shared_ptr<trun::TestResult> *)local_30);
  std::shared_ptr<trun::TestFunc>::~shared_ptr
            ((shared_ptr<trun::TestFunc> *)
             &result.super___shared_ptr<trun::TestResult,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return 0;
}

Assistant:

DLL_EXPORT int test_jsonreport_escape(ITesting *t) {
    auto tfunc = std::make_shared<trun::TestFunc>();
    auto result = trun::TestResult::Create("dummy");
    result->SetResult(trun::kTestResult_TestFail);
    trun::AssertError assertError;
    auto assertErrMsg = std::string("fopen(\"filename.txt\",\"r\");");
    assertError.Add(trun::AssertError::kAssert_Error, 0, "dummy.cpp", assertErrMsg);
    result->SetAssertError(assertError);

    tfunc->SetResultFromSubProcess(result);

    // Add this to the global result summary instance
    trun::ResultSummary::Instance().AddResult(tfunc);

    trun::ResultsReportJSON jsonReport;
    jsonReport.Begin();
    jsonReport.PrintReport();
    jsonReport.End();

    // I don't really have an interface to deal with testing the result without loading and doing shit..
    // this is verified through visual inspection of the result!

    return kTR_Pass;
}